

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O3

bool Map::testIndividualGraph
               (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *toTest,bool isContinent)

{
  size_t sVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  _Rb_tree_header *p_Var4;
  
  this = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)operator_new(0x30);
  p_Var4 = &(this->_M_impl).super__Rb_tree_header;
  (this->_M_impl).super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_M_impl).super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
  (this->_M_impl).super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
  (this->_M_impl).super__Rb_tree_header._M_node_count = 0;
  dfs((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)this,*(toTest->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl
               .super__Vector_impl_data._M_start,isContinent);
  sVar1 = (this->_M_impl).super__Rb_tree_header._M_node_count;
  ppCVar2 = (toTest->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar3 = (toTest->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(this);
  operator_delete(this,0x30);
  return sVar1 == (long)ppCVar2 - (long)ppCVar3 >> 3;
}

Assistant:

bool Map::testIndividualGraph(std::vector<Country*>* toTest, bool isContinent){
    auto* visitedCountries = new std::set<std::string>;
    //recurse through graph with an arbitrary starting point, if we visit all the countries in graph then its connected.
    dfs(visitedCountries,toTest[0][0],isContinent);
    bool connected = visitedCountries->size() == toTest->size();
    delete (visitedCountries);
    return connected;
}